

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

Mutex * __thiscall
el::LogDispatchCallback::fileHandle(LogDispatchCallback *this,LogDispatchData *data)

{
  string *__k;
  iterator iVar1;
  
  __k = base::TypedConfigurations::filename_abi_cxx11_
                  (data->m_logMessage->m_logger->m_typedConfigurations,data->m_logMessage->m_level);
  iVar1 = base::utils::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<el::base::threading::internal::NoMutex,_std::default_delete<el::base::threading::internal::NoMutex>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<el::base::threading::internal::NoMutex,_std::default_delete<el::base::threading::internal::NoMutex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_fileLocks)._M_h,__k);
  return *(Mutex **)
          ((long)iVar1.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<el::base::threading::internal::NoMutex,_std::default_delete<el::base::threading::internal::NoMutex>_>_>,_true>
                 ._M_cur + 0x28);
}

Assistant:

base::threading::Mutex& LogDispatchCallback::fileHandle(const LogDispatchData* data) {
  auto it = m_fileLocks.find(data->logMessage()->logger()->typedConfigurations()->filename(data->logMessage()->level()));
  return *(it->second.get());
}